

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O1

int si9ma::DP::find_way_dp(int *arr,int length,int start,int aim,int step)

{
  long lVar1;
  size_t __n;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  void *__s;
  void *__s_00;
  bool bVar10;
  undefined8 uStack_50;
  undefined8 local_48;
  size_t local_40;
  uint local_38;
  uint local_34;
  
  local_48 = &local_48;
  iVar2 = 0;
  iVar8 = 0;
  if ((((-1 < start && arr != (int *)0x0) && (iVar8 = iVar2, aim < length)) && (start < length)) &&
     (-1 < aim)) {
    uVar7 = (ulong)(uint)length;
    uVar3 = uVar7 * 4 + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar3;
    __s = (void *)((long)&local_48 + lVar1);
    __s_00 = (void *)((long)__s - uVar3);
    local_40 = uVar7 * 4;
    local_38 = aim;
    local_34 = start;
    *(undefined8 *)((long)__s_00 + -8) = 0x10e5a6;
    memset(__s,0,uVar7 * 4);
    __n = local_40;
    *(undefined8 *)((long)__s_00 + -8) = 0x10e5b4;
    memset(__s_00,0,__n);
    *(undefined4 *)((long)__s + (ulong)local_38 * 4) = 1;
    if (0 < step) {
      lVar4 = (ulong)(length - 1) << 2;
      uVar5 = 1;
      do {
        if (0 < length) {
          lVar6 = 0;
          do {
            if ((uVar5 & 1) == 0) {
              pvVar9 = __s;
              if (lVar6 == 0) {
                iVar8 = *(int *)((long)__s_00 + 4);
              }
              else if (lVar4 == lVar6) {
                iVar8 = *(int *)((long)__s_00 + lVar6 + -4);
              }
              else {
                iVar8 = *(int *)((long)__s_00 + lVar6 + 4) + *(int *)((long)__s_00 + lVar6 + -4);
              }
            }
            else {
              pvVar9 = __s_00;
              if (lVar6 == 0) {
                iVar8 = *(int *)((long)&local_48 + lVar1 + 4);
              }
              else if (lVar4 == lVar6) {
                iVar8 = *(int *)((long)&uStack_50 + lVar6 + lVar1 + 4);
              }
              else {
                iVar8 = *(int *)((long)&local_48 + lVar6 + lVar1 + 4) +
                        *(int *)((long)&uStack_50 + lVar6 + lVar1 + 4);
              }
            }
            *(int *)((long)pvVar9 + lVar6) = iVar8;
            lVar6 = lVar6 + 4;
          } while (uVar7 << 2 != lVar6);
        }
        bVar10 = uVar5 != step;
        uVar5 = uVar5 + 1;
      } while (bVar10);
      if ((step & 1U) != 0) {
        __s = __s_00;
      }
    }
    iVar8 = *(int *)((long)__s + (ulong)local_34 * 4);
  }
  return iVar8;
}

Assistant:

int DP::find_way_dp(int *arr, int length, int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        int res_arr[length];
        int res_arr_tmp[length];
        memset(res_arr,0, length*sizeof(res_arr[0]));
        memset(res_arr_tmp,0, length*sizeof(res_arr_tmp[0]));

        res_arr[aim] = 1;
        bool tmp_is_main = true;
        for (int i = 1; i <= step ; ++i) {
            for (int j = 0; j < length ; ++j) {
                if (tmp_is_main)
                    res_arr_tmp[j] = j == 0 ? res_arr[j + 1]
                                            : (j == length - 1 ? res_arr[j - 1] : res_arr[j - 1] + res_arr[j + 1]);
                else
                    res_arr[j] = j == 0 ? res_arr_tmp[j + 1]
                                        : (j == length - 1 ? res_arr_tmp[j - 1] : res_arr_tmp[j - 1] + res_arr_tmp[j + 1]);
            }
            tmp_is_main = !tmp_is_main;
        }

        return tmp_is_main ? res_arr[start] : res_arr_tmp[start];
    }